

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::Graph::addSpecialisationParameter(Graph *this,ProcessorAliasDeclaration *alias)

{
  pool_ref<soul::AST::ASTObject> local_38 [3];
  pool_ref<soul::AST::ProcessorAliasDeclaration> local_20;
  ProcessorAliasDeclaration *local_18;
  ProcessorAliasDeclaration *alias_local;
  Graph *this_local;
  
  local_18 = alias;
  alias_local = (ProcessorAliasDeclaration *)this;
  pool_ref<soul::AST::ProcessorAliasDeclaration>::
  pool_ref<soul::AST::ProcessorAliasDeclaration,void>(&local_20,alias);
  std::
  vector<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>_>_>
  ::push_back(&this->processorAliases,&local_20);
  pool_ref<soul::AST::ProcessorAliasDeclaration>::~pool_ref(&local_20);
  pool_ref<soul::AST::ASTObject>::pool_ref<soul::AST::ProcessorAliasDeclaration,void>
            (local_38,local_18);
  std::
  vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
  ::push_back(&(this->super_ProcessorBase).super_ModuleBase.specialisationParams,local_38);
  pool_ref<soul::AST::ASTObject>::~pool_ref(local_38);
  return;
}

Assistant:

void addSpecialisationParameter (ProcessorAliasDeclaration& alias) override
        {
            processorAliases.push_back (alias);
            specialisationParams.push_back (alias);
        }